

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_lib.cpp
# Opt level: O2

ze_result_t zelLoaderGetVersions(size_t *num_elems,zel_component_version_t *versions)

{
  ze_result_t zVar1;
  
  zVar1 = zelLoaderGetVersionsInternal(num_elems,versions);
  return zVar1;
}

Assistant:

ze_result_t ZE_APICALL
zelLoaderGetVersions(
   size_t *num_elems,                     //Pointer to num versions to get.
   zel_component_version_t *versions)     //Pointer to array of versions. If set to NULL, num_elems is returned
{
#ifdef DYNAMIC_LOAD_LOADER
    if(nullptr == ze_lib::context->loader)
        return ZE_RESULT_ERROR_UNINITIALIZED;
    typedef ze_result_t (ZE_APICALL *zelLoaderGetVersions_t)(size_t *num_elems, zel_component_version_t *versions);
    auto getVersions = reinterpret_cast<zelLoaderGetVersions_t>(
            GET_FUNCTION_PTR(ze_lib::context->loader, "zelLoaderGetVersionsInternal") );
    return getVersions(num_elems, versions);
#else
    return zelLoaderGetVersionsInternal(num_elems, versions);
#endif
}